

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.cpp
# Opt level: O0

void LockSignal_SignalShouldBeLocked(void)

{
  bool expected;
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  int in_ESI;
  int __sig;
  undefined1 local_18 [8];
  signal<void_()> sg;
  
  TestRunner::StartTest("LockSignal_SignalShouldBeLocked");
  lsignal::signal<void_()>::signal((signal<void_()> *)local_18,in_ESI,__handler);
  lsignal::signal<void_()>::set_lock((signal<void_()> *)local_18,true);
  expected = lsignal::signal<void_()>::is_locked((signal<void_()> *)local_18);
  __sig = 1;
  AssertHelper::VerifyValue(expected,true,"Signal should be locked.");
  lsignal::signal<void_()>::~signal((signal<void_()> *)local_18,__sig,__handler_00);
  return;
}

Assistant:

void LockSignal_SignalShouldBeLocked()
{
	TestRunner::StartTest(MethodName);

	lsignal::signal<void()> sg;

	sg.set_lock(true);

	AssertHelper::VerifyValue(sg.is_locked(), true, "Signal should be locked.");
}